

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O1

string * replaceWithMap(string *__return_storage_ptr__,string *input,
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *replacements)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __a;
  bool bVar3;
  iterator iVar4;
  pointer pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  _Rb_tree_header *p_Var12;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missedReplacements;
  string *result;
  smatch match;
  sregex_iterator it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matchedReplacements;
  regex re;
  undefined1 local_1d0 [32];
  _Base_ptr local_1b0;
  size_t local_1a8;
  string *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  _Base_ptr local_110;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_108;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  local_1a0 = __return_storage_ptr__;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50,"\\$\\{([^\\}]+)\\}",0x10);
  __a._M_current = (input->_M_dataplus)._M_p;
  std::__cxx11::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_iterator(&local_108,__a,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(__a._M_current + input->_M_string_length),&local_50,0);
  local_c8._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._M_match._M_begin._M_current = (char *)0x0;
  local_c8._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_pregex = (regex_type *)0x0;
  local_c8._M_flags = 0;
  local_c8._28_4_ = 0;
  local_c8._M_begin._M_current = (char *)0x0;
  local_c8._M_end._M_current = (char *)0x0;
  bVar3 = std::__cxx11::
          regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator==(&local_108,&local_c8);
  if (bVar3) {
    if ((replacements->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
      __assert_fail("replacements.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/XMLHelper.hpp"
                    ,0x17c,
                    "std::string replaceWithMap(const std::string &, std::map<std::string, std::string>)"
                   );
    }
    (local_1a0->_M_dataplus)._M_p = (pointer)&local_1a0->field_2;
    pcVar5 = (input->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,pcVar5,pcVar5 + input->_M_string_length);
  }
  else {
    local_80._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_80._M_impl.super__Rb_tree_header._M_header;
    local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_118 = &local_1a0->field_2;
    (local_1a0->_M_dataplus)._M_p = (pointer)local_118;
    local_80._M_impl.super__Rb_tree_header._M_header._M_right =
         local_80._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"");
    bVar3 = std::__cxx11::
            regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::operator==(&local_108,&local_c8);
    if (!bVar3) {
      pcVar2 = local_1d0 + 0x10;
      local_110 = &(replacements->_M_t)._M_impl.super__Rb_tree_header._M_header;
      do {
        std::
        vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::vector((vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&local_158,
                 &local_108._M_match.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                );
        local_158.first.field_2._8_8_ = local_108._M_match._M_begin._M_current;
        if (local_158.first._M_dataplus._M_p == (pointer)local_158.first._M_string_length) {
          bVar3 = false;
        }
        else {
          bVar3 = ((long)(local_158.first._M_string_length - (long)local_158.first._M_dataplus._M_p)
                  >> 3) * -0x5555555555555555 - 5U < 0xfffffffffffffffe;
        }
        pcVar5 = (pointer)(local_158.first._M_string_length + -0x48);
        if (bVar3) {
          pcVar5 = local_158.first._M_dataplus._M_p + 0x18;
        }
        local_1d0._0_8_ = pcVar2;
        if (pcVar5[0x10] == '\x01') {
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)local_1d0,*(undefined8 *)pcVar5,*(undefined8 *)(pcVar5 + 8));
        }
        else {
          local_1d0._8_8_ = 0;
          local_1d0._16_8_ = local_1d0._16_8_ & 0xffffffffffffff00;
        }
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&replacements->_M_t,(key_type *)local_1d0);
        if ((char *)local_1d0._0_8_ != pcVar2) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
        if (iVar4._M_node == local_110) {
          __assert_fail("itReplacement != replacements.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/XMLHelper.hpp"
                        ,0x189,
                        "std::string replaceWithMap(const std::string &, std::map<std::string, std::string>)"
                       );
        }
        if (local_158.first._M_dataplus._M_p == (pointer)local_158.first._M_string_length) {
          bVar3 = false;
        }
        else {
          bVar3 = ((long)(local_158.first._M_string_length - (long)local_158.first._M_dataplus._M_p)
                  >> 3) * -0x5555555555555555 - 5U < 0xfffffffffffffffe;
        }
        pcVar5 = (pointer)(local_158.first._M_string_length + -0x48);
        if (bVar3) {
          pcVar5 = local_158.first._M_dataplus._M_p + 0x18;
        }
        if (pcVar5[0x10] == '\x01') {
          local_1d0._0_8_ = pcVar2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)local_1d0,*(undefined8 *)pcVar5,*(undefined8 *)(pcVar5 + 8));
        }
        else {
          local_1d0._8_8_ = 0;
          local_1d0._16_8_ = local_1d0._16_8_ & 0xffffffffffffff00;
          local_1d0._0_8_ = pcVar2;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_80,(key_type *)local_1d0);
        if ((char *)local_1d0._0_8_ != pcVar2) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
        lVar9 = -0x30;
        if ((ulong)(((long)(local_158.first._M_string_length -
                           (long)local_158.first._M_dataplus._M_p) >> 3) * -0x5555555555555555) < 4)
        {
          lVar9 = -0x48;
        }
        if (*(char *)(local_158.first._M_string_length + lVar9 + 0x10) == '\x01') {
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_198,*(undefined8 *)(local_158.first._M_string_length + lVar9),
                     *(undefined8 *)(local_158.first._M_string_length + lVar9 + 8));
        }
        else {
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          local_198._M_string_length = 0;
          local_198.field_2._M_local_buf[0] = '\0';
        }
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,*(long *)(iVar4._M_node + 2),
                   (long)&(iVar4._M_node[2]._M_parent)->_M_color + *(long *)(iVar4._M_node + 2));
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          uVar10 = CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                            local_198.field_2._M_local_buf[0]);
        }
        if (uVar10 < local_178._M_string_length + local_198._M_string_length) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            uVar11 = local_178.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < local_178._M_string_length + local_198._M_string_length)
          goto LAB_001177d8;
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_178,0,0,local_198._M_dataplus._M_p,local_198._M_string_length);
        }
        else {
LAB_001177d8:
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_198,local_178._M_dataplus._M_p,local_178._M_string_length);
        }
        local_1d0._0_8_ = (pbVar6->_M_dataplus)._M_p;
        paVar1 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._0_8_ == paVar1) {
          local_1d0._16_8_ = paVar1->_M_allocated_capacity;
          local_1d0._24_8_ = *(long *)((long)&pbVar6->field_2 + 8);
          local_1d0._0_8_ = pcVar2;
        }
        else {
          local_1d0._16_8_ = paVar1->_M_allocated_capacity;
        }
        local_1d0._8_8_ = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
        pbVar6->_M_string_length = 0;
        paVar1->_M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (local_1a0,(char *)local_1d0._0_8_,local_1d0._8_8_);
        if ((char *)local_1d0._0_8_ != pcVar2) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::
        regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
        ::operator++(&local_108);
        bVar3 = std::__cxx11::
                regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                ::operator==(&local_108,&local_c8);
        if (bVar3) {
          lVar9 = -0x18;
          if ((ulong)(((long)(local_158.first._M_string_length -
                             (long)local_158.first._M_dataplus._M_p) >> 3) * -0x5555555555555555) <
              4) {
            lVar9 = -0x48;
          }
          if (*(char *)(local_158.first._M_string_length + lVar9 + 0x10) == '\x01') {
            local_1d0._0_8_ = pcVar2;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)local_1d0,*(undefined8 *)(local_158.first._M_string_length + lVar9)
                       ,*(undefined8 *)(local_158.first._M_string_length + lVar9 + 8));
          }
          else {
            local_1d0._8_8_ = 0;
            local_1d0._16_8_ = local_1d0._16_8_ & 0xffffffffffffff00;
            local_1d0._0_8_ = pcVar2;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (local_1a0,(char *)local_1d0._0_8_,local_1d0._8_8_);
          if ((char *)local_1d0._0_8_ != pcVar2) {
            operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
          }
        }
        if (local_158.first._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_158.first._M_dataplus._M_p,
                          local_158.first.field_2._M_allocated_capacity -
                          (long)local_158.first._M_dataplus._M_p);
        }
        bVar3 = std::__cxx11::
                regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                ::operator==(&local_108,&local_c8);
      } while (!bVar3);
    }
    local_1d0._24_8_ = local_1d0 + 8;
    local_1d0._8_8_ = local_1d0._8_8_ & 0xffffffff00000000;
    local_1d0._16_8_ = 0;
    local_1a8 = 0;
    p_Var8 = (replacements->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = &(replacements->_M_t)._M_impl.super__Rb_tree_header;
    local_1b0 = (_Base_ptr)local_1d0._24_8_;
    if ((_Rb_tree_header *)p_Var8 != p_Var12) {
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair(&local_158,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(p_Var8 + 1));
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_80,&local_158.first);
        if ((_Rb_tree_header *)iVar7._M_node == &local_80._M_impl.super__Rb_tree_header) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_1d0,&local_158.first);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.second._M_dataplus._M_p != &local_158.second.field_2) {
          operator_delete(local_158.second._M_dataplus._M_p,
                          local_158.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.first._M_dataplus._M_p != &local_158.first.field_2) {
          operator_delete(local_158.first._M_dataplus._M_p,
                          local_158.first.field_2._M_allocated_capacity + 1);
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var12);
    }
    if (local_1a8 != 0) {
      __assert_fail("missedReplacements.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/XMLHelper.hpp"
                    ,0x1a0,
                    "std::string replaceWithMap(const std::string &, std::map<std::string, std::string>)"
                   );
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_80);
  }
  if (local_c8._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8._M_match.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8._M_match.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8._M_match.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108._M_match.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108._M_match.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108._M_match.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
  return local_1a0;
}

Assistant:

inline std::string replaceWithMap( std::string const & input, std::map<std::string, std::string> replacements )
{
  // This will match ${someVariable} and contain someVariable in match group 1
  std::regex re( R"(\$\{([^\}]+)\})" );
  auto       it  = std::sregex_iterator( input.begin(), input.end(), re );
  auto       end = std::sregex_iterator();

  // No match, just return the original string
  if ( it == end )
  {
    assert( replacements.empty() );
    return input;
  }

#if !defined( NDEBUG )
  std::set<std::string> matchedReplacements;
#endif

  std::string result = "";
  while ( it != end )
  {
    std::smatch match         = *it;
    auto        itReplacement = replacements.find( match[1].str() );
    assert( itReplacement != replacements.end() );
#if !defined( NDEBUG )
    matchedReplacements.insert( match[1].str() );
#endif

    result += match.prefix().str() + ( ( itReplacement != replacements.end() ) ? itReplacement->second : match[0].str() );
    ++it;

    // we've passed the last match. Append the rest of the orignal string
    if ( it == end )
    {
      result += match.suffix().str();
    }
  }
#if !defined( NDEBUG )
  std::set<std::string> missedReplacements;
  for ( auto r : replacements )
  {
    if ( matchedReplacements.find( r.first ) == matchedReplacements.end() )
    {
      missedReplacements.insert( r.first );
    }
  }
  assert( missedReplacements.empty() );
#endif
  return result;
}